

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O0

int Of_ManComputeForwardCut(Of_Man_t *p,int iObj,int *pCut)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int local_2c;
  int DelayLut1;
  int Delay;
  int iVar;
  int k;
  int *pCut_local;
  int iObj_local;
  Of_Man_t *p_local;
  
  local_2c = 0;
  iVar1 = p->pPars->nDelayLut1;
  Delay = 0;
  while( true ) {
    iVar2 = Of_CutSize(pCut);
    bVar3 = false;
    if (Delay < iVar2) {
      DelayLut1 = Of_CutVar(pCut,Delay);
      bVar3 = DelayLut1 != 0;
    }
    if (!bVar3) break;
    iVar2 = Of_ObjDelay1(p,DelayLut1);
    local_2c = Abc_MaxInt(local_2c,iVar2 + iVar1);
    Delay = Delay + 1;
  }
  Of_CutSetDelay1(pCut,local_2c);
  return local_2c;
}

Assistant:

static inline int Of_ManComputeForwardCut( Of_Man_t * p, int iObj, int * pCut )
{
    int k, iVar, Delay = 0;
    int DelayLut1 = p->pPars->nDelayLut1;
    Of_CutForEachVar( pCut, iVar, k )
        Delay = Abc_MaxInt( Delay, Of_ObjDelay1(p, iVar) + DelayLut1 );
    Of_CutSetDelay1( pCut, Delay );
    return Delay;
}